

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eset.c
# Opt level: O1

void duckdb_je_eset_remove(eset_t *eset,edata_t *edata)

{
  atomic_zu_t *paVar1;
  ulong uVar2;
  void *pvVar3;
  ulong uVar4;
  void *pvVar5;
  long lVar6;
  _Bool _Var7;
  size_t sVar8;
  edata_t *peVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  eset_bin_t *ph;
  
  uVar2 = (edata->field_2).e_size_esn;
  uVar14 = uVar2 & 0xfffffffffffff000;
  sVar8 = duckdb_je_sz_psz_quantize_floor(uVar14);
  if (sVar8 < 0x7000000000000001) {
    uVar12 = sVar8 - 1;
    if (uVar12 == 0) {
      uVar11 = 0x40;
    }
    else {
      lVar6 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      uVar11 = (uint)lVar6 ^ 0x3f;
    }
    iVar13 = 0x32 - uVar11;
    if (0x32 < uVar11) {
      iVar13 = 0;
    }
    bVar10 = 0xc;
    if (0x4000 < sVar8) {
      bVar10 = (char)iVar13 + 0xb;
    }
    uVar12 = (ulong)(((uint)(uVar12 >> (bVar10 & 0x3f)) & 3) + iVar13 * 4);
  }
  else {
    uVar12 = 199;
  }
  eset->bin_stats[uVar12].nextents.repr = eset->bin_stats[uVar12].nextents.repr - 1;
  paVar1 = &eset->bin_stats[uVar12].nbytes;
  paVar1->repr = paVar1->repr - uVar14;
  pvVar3 = edata->e_addr;
  uVar14 = edata->e_sn;
  ph = eset->bins + uVar12;
  duckdb_je_edata_heap_remove(&ph->heap,edata);
  _Var7 = duckdb_je_edata_heap_empty(&ph->heap);
  if (_Var7) {
    bVar10 = (byte)uVar12 & 0x3f;
    eset->bitmap[uVar12 >> 6] =
         eset->bitmap[uVar12 >> 6] & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
  }
  else {
    uVar4 = eset->bins[uVar12].heap_min.sn;
    pvVar5 = (void *)eset->bins[uVar12].heap_min.addr;
    if (-((uint)(pvVar5 >= pvVar3 && pvVar5 != pvVar3) - (uint)(pvVar5 < pvVar3)) ==
        ((uint)(uVar14 >= uVar4 && uVar14 != uVar4) - (uint)(uVar14 < uVar4)) * -2) {
      peVar9 = duckdb_je_edata_heap_first(&ph->heap);
      pvVar3 = peVar9->e_addr;
      eset->bins[uVar12].heap_min.sn = peVar9->e_sn;
      eset->bins[uVar12].heap_min.addr = (uintptr_t)pvVar3;
    }
  }
  peVar9 = (eset->lru).head.qlh_first;
  if (peVar9 == edata) {
    (eset->lru).head.qlh_first = (peVar9->field_6).ql_link_inactive.qre_next;
  }
  if ((eset->lru).head.qlh_first == edata) {
    (eset->lru).head.qlh_first = (edata_t *)0x0;
  }
  else {
    (((edata->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next =
         (((edata->field_6).ql_link_inactive.qre_next)->field_6).ql_link_inactive.qre_prev;
    (((edata->field_6).ql_link_inactive.qre_next)->field_6).ql_link_inactive.qre_prev =
         (edata->field_6).ql_link_inactive.qre_prev;
    peVar9 = (edata->field_6).ql_link_inactive.qre_next;
    (edata->field_6).ql_link_inactive.qre_prev =
         (((edata->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next;
    (((peVar9->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next = peVar9;
    (((edata->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next = edata;
  }
  (eset->npages).repr = (eset->npages).repr - (uVar2 >> 0xc);
  return;
}

Assistant:

void
eset_remove(eset_t *eset, edata_t *edata) {
	assert(edata_state_get(edata) == eset->state ||
	    edata_state_in_transition(edata_state_get(edata)));

	size_t size = edata_size_get(edata);
	size_t psz = sz_psz_quantize_floor(size);
	pszind_t pind = sz_psz2ind(psz);
	if (config_stats) {
		eset_stats_sub(eset, pind, size);
	}

	edata_cmp_summary_t edata_cmp_summary = edata_cmp_summary_get(edata);
	edata_heap_remove(&eset->bins[pind].heap, edata);
	if (edata_heap_empty(&eset->bins[pind].heap)) {
		fb_unset(eset->bitmap, ESET_NPSIZES, (size_t)pind);
	} else {
		/*
		 * This is a little weird; we compare if the summaries are
		 * equal, rather than if the edata we removed was the heap
		 * minimum.  The reason why is that getting the heap minimum
		 * can cause a pairing heap merge operation.  We can avoid this
		 * if we only update the min if it's changed, in which case the
		 * summaries of the removed element and the min element should
		 * compare equal.
		 */
		if (edata_cmp_summary_comp(edata_cmp_summary,
		    eset->bins[pind].heap_min) == 0) {
			eset->bins[pind].heap_min = edata_cmp_summary_get(
			    edata_heap_first(&eset->bins[pind].heap));
		}
	}
	edata_list_inactive_remove(&eset->lru, edata);
	size_t npages = size >> LG_PAGE;
	/*
	 * As in eset_insert, we hold eset->mtx and so don't need atomic
	 * operations for updating eset->npages.
	 */
	size_t cur_extents_npages =
	    atomic_load_zu(&eset->npages, ATOMIC_RELAXED);
	assert(cur_extents_npages >= npages);
	atomic_store_zu(&eset->npages,
	    cur_extents_npages - (size >> LG_PAGE), ATOMIC_RELAXED);
}